

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder_graph.cc
# Opt level: O3

void __thiscall S2Builder::Graph::VertexOutMap::Init(VertexOutMap *this,Graph *g)

{
  iterator __position;
  bool bVar1;
  int iVar2;
  int iVar3;
  pointer ppVar4;
  int iVar5;
  EdgeId e;
  int local_2c;
  
  this->edges_ = g->edges_;
  std::vector<int,_std::allocator<int>_>::reserve(&this->edge_begins_,(long)g->num_vertices_ + 1);
  local_2c = 0;
  if (-1 < g->num_vertices_) {
    iVar5 = 0;
    do {
      ppVar4 = (g->edges_->
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      iVar3 = (int)((ulong)((long)(g->edges_->
                                  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                  )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4) >> 3);
      iVar2 = local_2c;
      if (local_2c < iVar3) {
        ppVar4 = ppVar4 + local_2c;
        do {
          iVar2 = local_2c;
          if (iVar5 <= ppVar4->first) break;
          local_2c = local_2c + 1;
          ppVar4 = ppVar4 + 1;
          iVar2 = iVar3;
        } while (iVar3 != local_2c);
      }
      __position._M_current =
           (this->edge_begins_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->edge_begins_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->edge_begins_,__position,&local_2c);
      }
      else {
        *__position._M_current = iVar2;
        (this->edge_begins_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      bVar1 = iVar5 < g->num_vertices_;
      iVar5 = iVar5 + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void Graph::VertexOutMap::Init(const Graph& g) {
  edges_ = &g.edges();
  edge_begins_.reserve(g.num_vertices() + 1);
  EdgeId e = 0;
  for (VertexId v = 0; v <= g.num_vertices(); ++v) {
    while (e < g.num_edges() && g.edge(e).first < v) ++e;
    edge_begins_.push_back(e);
  }
}